

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlDebugDumpEntities(FILE *output,xmlDocPtr doc)

{
  undefined1 local_b8 [8];
  xmlDebugCtxt ctxt;
  xmlDocPtr doc_local;
  FILE *output_local;
  
  if (output != (FILE *)0x0) {
    ctxt._152_8_ = doc;
    xmlCtxtDumpInitCtxt((xmlDebugCtxtPtr)local_b8);
    local_b8 = (undefined1  [8])output;
    xmlCtxtDumpEntities((xmlDebugCtxtPtr)local_b8,(xmlDocPtr)ctxt._152_8_);
    xmlCtxtDumpCleanCtxt((xmlDebugCtxtPtr)local_b8);
  }
  return;
}

Assistant:

void
xmlDebugDumpEntities(FILE * output, xmlDocPtr doc)
{
    xmlDebugCtxt ctxt;

    if (output == NULL) return;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.output = output;
    xmlCtxtDumpEntities(&ctxt, doc);
    xmlCtxtDumpCleanCtxt(&ctxt);
}